

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  byte *iEnd;
  byte *iStart;
  U32 *pUVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 UVar5;
  ulong uVar6;
  ldmEntry_t *plVar7;
  BYTE *pBVar8;
  U64 UVar9;
  size_t sVar10;
  rawSeq *prVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  undefined4 uVar15;
  ldmParams_t ldmParams;
  byte *pbVar16;
  BYTE *pBVar17;
  U32 UVar18;
  U32 UVar19;
  uint uVar20;
  U32 hbits;
  U32 UVar21;
  ulong uVar22;
  byte *pbVar23;
  ulong uVar24;
  bool bVar25;
  int iVar26;
  ulong *src_00;
  BYTE *pBVar27;
  byte *pbVar28;
  long lVar29;
  byte *pbVar30;
  byte *pbVar31;
  long lVar32;
  U64 hash;
  uint maxDist;
  U32 UVar33;
  ulong uVar34;
  ulong *puVar35;
  ulong *puVar36;
  ulong *puVar37;
  ulong *ip;
  ulong uVar38;
  byte *pbVar39;
  ldmEntry_t *plVar40;
  size_t curTotalMatchLength;
  ulong *puVar41;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  ulong *local_208;
  ulong local_1a8;
  byte *local_190;
  byte *local_150;
  ulong local_148;
  ldmEntry_t *local_140;
  byte *local_138;
  size_t local_128;
  int iStack_7c;
  
  maxDist = 1 << ((byte)params->windowLog & 0x1f);
  uVar12 = (ulong)((srcSize & 0xfffff) == 0);
  uVar13 = (srcSize >> 0x14) + 1;
  if ((ldmState->window).nextSrc < (ulong *)((long)src + srcSize)) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44ee,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->size < sequences->pos) {
    __assert_fail("sequences->pos <= sequences->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44f2,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->capacity < sequences->size) {
    __assert_fail("sequences->size <= sequences->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44f3,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (uVar13 != uVar12) {
    lVar32 = 0;
    local_1a8 = 0;
    do {
      uVar38 = (ulong)maxDist;
      uVar6 = sequences->size;
      if (sequences->capacity <= uVar6) {
        return 0;
      }
      src_00 = (ulong *)((long)src + lVar32 * 0x100000);
      puVar37 = src_00 + 0x20000;
      if (srcSize + lVar32 * -0x100000 < 0x100000) {
        puVar37 = (ulong *)((long)src + srcSize);
      }
      if ((long)srcSize <= lVar32 * 0x100000) {
        __assert_fail("chunkStart < iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x44fd,
                      "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                     );
      }
      if (0xe0000000 < (uint)((int)puVar37 - *(int *)&(ldmState->window).base)) {
        UVar18 = params->hashLog;
        UVar19 = ZSTD_window_correctOverflow(&ldmState->window,0,maxDist,src_00);
        plVar7 = ldmState->hashTable;
        lVar29 = 0;
        do {
          uVar20 = plVar7[lVar29].offset;
          UVar33 = uVar20 - UVar19;
          if (uVar20 < UVar19) {
            UVar33 = 0;
          }
          plVar7[lVar29].offset = UVar33;
          lVar29 = lVar29 + 1;
        } while (1L << ((byte)UVar18 & 0x3f) != lVar29);
      }
      pBVar8 = (ldmState->window).base;
      iVar26 = (int)pBVar8;
      uVar20 = (int)puVar37 - iVar26;
      if (ldmState->loadedDictEnd + maxDist < uVar20) {
        uVar20 = uVar20 - maxDist;
        if ((ldmState->window).lowLimit < uVar20) {
          (ldmState->window).lowLimit = uVar20;
        }
        uVar20 = (ldmState->window).lowLimit;
        if ((ldmState->window).dictLimit < uVar20) {
          (ldmState->window).dictLimit = uVar20;
        }
        ldmState->loadedDictEnd = 0;
      }
      UVar18 = params->bucketSizeLog;
      uVar20 = (ldmState->window).dictLimit;
      UVar19 = params->hashRateLog;
      uVar2 = (ldmState->window).lowLimit;
      UVar33 = params->hashLog;
      uVar3 = params->minMatchLength;
      pbVar39 = (byte *)(ulong)uVar3;
      UVar9 = ldmState->hashPower;
      uVar14 = uVar20;
      if (uVar20 > uVar2) {
        uVar14 = uVar2;
      }
      if (uVar20 <= uVar2) {
        pBVar27 = (BYTE *)0x0;
      }
      else {
        pBVar27 = (ldmState->window).dictBase;
      }
      uVar34 = (long)puVar37 - (long)src_00;
      pbVar30 = pBVar27 + uVar20;
      pbVar16 = pBVar27 + uVar14;
      if (uVar20 <= uVar2) {
        pbVar30 = (byte *)0x0;
        pbVar16 = (byte *)0x0;
      }
      uVar22 = 8;
      if (8 < uVar3) {
        uVar22 = (ulong)uVar3;
      }
      iEnd = (byte *)((long)src_00 + uVar34);
      puVar35 = (ulong *)(iEnd + -uVar22);
      local_208 = src_00;
      if (src_00 <= puVar35) {
        hbits = UVar33 - UVar18;
        iStart = pBVar8 + uVar20;
        hash = 0;
        puVar36 = (ulong *)0x0;
        ip = src_00;
        do {
          if (ip == src_00) {
            if (uVar3 == 0) {
              hash = 0;
            }
            else {
              pbVar23 = (byte *)0x0;
              hash = 0;
              do {
                hash = hash * -0x30e44323485a9b9d + (ulong)*(byte *)((long)ip + (long)pbVar23) + 10;
                pbVar23 = pbVar23 + 1;
              } while (pbVar39 != pbVar23);
            }
          }
          else {
            hash = (hash - ((ulong)(byte)*puVar36 + 10) * UVar9) * -0x30e44323485a9b9d +
                   (ulong)*(byte *)((long)puVar36 + (long)pbVar39) + 10;
          }
          UVar21 = ZSTD_ldm_getTag(hash,hbits,UVar19);
          if ((UVar21 ^ -1 << ((byte)UVar19 & 0x1f)) == 0xffffffff) {
            if (0x20 < hbits) {
              __assert_fail("numBits <= 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x437a,"U32 ZSTD_ldm_getSmallHash(U64, U32)");
            }
            UVar21 = (int)ip - iVar26;
            uVar22 = hash >> (0x40U - (char)hbits & 0x3f) & 0xffffffff;
            if (UVar33 == UVar18) {
              uVar22 = 0;
            }
            plVar40 = ldmState->hashTable + (uVar22 << ((byte)params->bucketSizeLog & 0x3f));
            plVar7 = plVar40 + (1L << ((byte)UVar18 & 0x3f));
            local_150 = (byte *)0x0;
            local_148 = 0;
            local_140 = (ldmEntry_t *)0x0;
            local_138 = (byte *)0x0;
            do {
              if (plVar40->checksum == (U32)(hash >> (0x20U - (char)hbits & 0x3f))) {
                uVar4 = plVar40->offset;
                if (uVar14 < uVar4) {
                  if (uVar2 < uVar20) {
                    pbVar23 = iEnd;
                    pBVar17 = pBVar8;
                    if (uVar4 < uVar20) {
                      pbVar23 = pbVar30;
                      pBVar17 = pBVar27;
                    }
                    pbVar23 = (byte *)ZSTD_count_2segments
                                                ((BYTE *)ip,pBVar17 + uVar4,iEnd,pbVar23,iStart);
                    if (pbVar39 <= pbVar23) {
                      pbVar28 = iStart;
                      if (uVar4 < uVar20) {
                        pbVar28 = pbVar16;
                      }
                      if (local_208 < ip) {
                        uVar38 = 0;
                        if (pbVar28 < pBVar17 + uVar4) {
                          pbVar31 = pBVar17 + uVar4;
                          uVar38 = 0;
                          puVar36 = (ulong *)((long)ip + -1);
                          do {
                            pbVar31 = pbVar31 + -1;
                            if (((byte)*puVar36 != *pbVar31) ||
                               (uVar38 = uVar38 + 1, puVar36 <= local_208)) break;
                            puVar36 = (ulong *)((long)puVar36 + -1);
                          } while (pbVar28 < pbVar31);
                        }
                      }
                      else {
                        uVar38 = 0;
                      }
                      local_190 = pbVar23 + uVar38;
                    }
                  }
                  else {
                    puVar36 = (ulong *)(pBVar8 + uVar4);
                    puVar41 = ip;
                    if (ip < iEnd + -7) {
                      uVar24 = *ip ^ *puVar36;
                      uVar22 = 0;
                      if (uVar24 != 0) {
                        for (; (uVar24 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      pbVar23 = (byte *)(uVar22 >> 3 & 0x1fffffff);
                      if (*puVar36 == *ip) {
                        do {
                          puVar41 = puVar41 + 1;
                          puVar36 = puVar36 + 1;
                          if (iEnd + -7 <= puVar41) goto LAB_00159bfb;
                          uVar24 = *puVar41 ^ *puVar36;
                          uVar22 = 0;
                          if (uVar24 != 0) {
                            for (; (uVar24 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                            }
                          }
                          pbVar23 = (byte *)((long)puVar41 + ((uVar22 >> 3 & 0x1fffffff) - (long)ip)
                                            );
                        } while (*puVar36 == *puVar41);
                      }
                    }
                    else {
LAB_00159bfb:
                      if ((puVar41 < iEnd + -3) && ((int)*puVar36 == (int)*puVar41)) {
                        puVar41 = (ulong *)((long)puVar41 + 4);
                        puVar36 = (ulong *)((long)puVar36 + 4);
                      }
                      if ((puVar41 < iEnd + -1) && ((short)*puVar36 == (short)*puVar41)) {
                        puVar41 = (ulong *)((long)puVar41 + 2);
                        puVar36 = (ulong *)((long)puVar36 + 2);
                      }
                      if (puVar41 < puVar37) {
                        puVar41 = (ulong *)((long)puVar41 +
                                           (ulong)((byte)*puVar36 == (byte)*puVar41));
                      }
                      pbVar23 = (byte *)((long)puVar41 - (long)ip);
                    }
                    if (pbVar39 <= pbVar23) {
                      if (local_208 < ip) {
                        uVar38 = 0;
                        if (uVar20 < uVar4) {
                          uVar38 = 0;
                          puVar36 = (ulong *)((long)ip + -1);
                          pbVar28 = pBVar8 + ((ulong)uVar4 - 1);
                          do {
                            if (((byte)*puVar36 != *pbVar28) ||
                               (uVar38 = uVar38 + 1, puVar36 <= local_208)) break;
                            puVar36 = (ulong *)((long)puVar36 + -1);
                            bVar25 = iStart < pbVar28;
                            pbVar28 = pbVar28 + -1;
                          } while (bVar25);
                        }
                      }
                      else {
                        uVar38 = 0;
                      }
                      local_190 = pbVar23 + uVar38;
                    }
                  }
                  if ((pbVar39 <= pbVar23) && (local_138 < local_190)) {
                    local_150 = pbVar23;
                    local_148 = uVar38;
                    local_140 = plVar40;
                    local_138 = local_190;
                  }
                }
              }
              plVar40 = plVar40 + 1;
            } while (plVar40 < plVar7);
            if (local_140 == (ldmEntry_t *)0x0) {
              ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar21,*params);
              puVar41 = (ulong *)((long)ip + 1);
              bVar25 = false;
            }
            else {
              puVar41 = (ulong *)((long)ip - local_148);
              sVar10 = sequences->size;
              bVar25 = true;
              if (sVar10 != sequences->capacity) {
                prVar11 = sequences->seq;
                UVar5 = local_140->offset;
                prVar11[sVar10].litLength = (int)puVar41 - (int)local_208;
                prVar11[sVar10].matchLength = (int)local_148 + (int)local_150;
                prVar11[sVar10].offset = UVar21 - UVar5;
                sequences->size = sVar10 + 1;
                ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar21,*params);
                puVar41 = (ulong *)((long)ip + (long)local_150);
                local_208 = puVar41;
                if (puVar35 < puVar41) goto LAB_0015998b;
                uVar15 = params->minMatchLength;
                ldmParams = *params;
                if (1 < (long)local_150) {
                  local_150 = local_150 + -1;
                  UVar21 = (1 - iVar26) + (int)ip;
                  do {
                    hash = (hash - ((ulong)(byte)*ip + 10) * ldmState->hashPower) *
                           -0x30e44323485a9b9d +
                           (ulong)*(byte *)((long)ip + (ulong)(uVar15 - 1) + 1) + 10;
                    ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar21,ldmParams);
                    ip = (ulong *)((long)ip + 1);
                    UVar21 = UVar21 + 1;
                    local_150 = local_150 + -1;
                  } while (local_150 != (byte *)0x0);
                }
                ip = (ulong *)((long)puVar41 + -1);
                bVar25 = false;
              }
            }
          }
          else {
            puVar41 = (ulong *)((long)ip + 1);
LAB_0015998b:
            bVar25 = false;
          }
          if (bVar25) {
            uVar38 = 0xffffffffffffffba;
            goto LAB_001597e8;
          }
          puVar36 = ip;
          ip = puVar41;
        } while (puVar41 <= puVar35);
      }
      uVar38 = (long)puVar37 - (long)local_208;
LAB_001597e8:
      uVar22 = uVar38;
      if (uVar38 < 0xffffffffffffff89) {
        uVar22 = local_128;
        if (uVar6 < sequences->size) {
          pUVar1 = &sequences->seq[uVar6].litLength;
          *pUVar1 = *pUVar1 + (int)local_1a8;
          local_1a8 = uVar38;
        }
        else {
          if (uVar38 != uVar34) {
            __assert_fail("newLeftoverSize == chunkSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x451c,
                          "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                         );
          }
          local_1a8 = local_1a8 + uVar34;
        }
      }
      local_128 = uVar22;
      if (0xffffffffffffff88 < uVar38) {
        return local_128;
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 != uVar13 - uVar12);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}